

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::AddUserKey(UDMFParser *this,FName *key,int kind,int index)

{
  long lVar1;
  Node *pNVar2;
  long lVar3;
  FUDMFKeys *this_00;
  int iVar4;
  FUDMFKey *pFVar5;
  FUDMFKey local_40;
  
  pNVar2 = TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::GetNode
                     (UDMFKeys + kind,index);
  this_00 = &(pNVar2->Pair).Value;
  lVar1 = -0x20;
  while (lVar3 = lVar1,
        (ulong)(pNVar2->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count << 5 != lVar3 + 0x20) {
    pFVar5 = (this_00->super_TArray<FUDMFKey,_FUDMFKey>).Array;
    lVar1 = lVar3 + 0x20;
    if (*(int *)((long)&pFVar5[1].Key.Index + lVar3) == key->Index) {
      iVar4 = (this->super_UDMFParserBase).sc.TokenType;
      pFVar5 = (FUDMFKey *)((long)&pFVar5[1].Key.Index + lVar3);
      if (iVar4 == 0x14c) {
        iVar4 = 0;
      }
      else {
        if (iVar4 == 0x106) {
          FUDMFKey::operator=(pFVar5,(this->super_UDMFParserBase).sc.Float);
          return;
        }
        if (iVar4 == 0x14b) {
          iVar4 = 1;
        }
        else {
          if (iVar4 != 0x104) {
            FUDMFKey::operator=(pFVar5,&(this->super_UDMFParserBase).parsedString);
            return;
          }
          iVar4 = (this->super_UDMFParserBase).sc.Number;
        }
      }
      FUDMFKey::operator=(pFVar5,iVar4);
      return;
    }
  }
  local_40.StringVal.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_40.Key = (FName)key->Index;
  iVar4 = (this->super_UDMFParserBase).sc.TokenType;
  if (iVar4 == 0x14c) {
    iVar4 = 0;
  }
  else {
    if (iVar4 == 0x106) {
      FUDMFKey::operator=(&local_40,(this->super_UDMFParserBase).sc.Float);
      goto LAB_004e80ea;
    }
    if (iVar4 == 0x14b) {
      iVar4 = 1;
    }
    else {
      if (iVar4 != 0x104) {
        FUDMFKey::operator=(&local_40,&(this->super_UDMFParserBase).parsedString);
        goto LAB_004e80ea;
      }
      iVar4 = (this->super_UDMFParserBase).sc.Number;
    }
  }
  FUDMFKey::operator=(&local_40,iVar4);
LAB_004e80ea:
  TArray<FUDMFKey,_FUDMFKey>::Push(&this_00->super_TArray<FUDMFKey,_FUDMFKey>,&local_40);
  FString::~FString(&local_40.StringVal);
  return;
}

Assistant:

void AddUserKey(FName key, int kind, int index)
	{
		FUDMFKeys &keyarray = UDMFKeys[kind][index];

		for(unsigned i=0; i < keyarray.Size(); i++)
		{
			if (keyarray[i].Key == key)
			{
				switch (sc.TokenType)
				{
				case TK_IntConst:
					keyarray[i] = sc.Number;
					break;
				case TK_FloatConst:
					keyarray[i] = sc.Float;
					break;
				default:
				case TK_StringConst:
					keyarray[i] = parsedString;
					break;
				case TK_True:
					keyarray[i] = 1;
					break;
				case TK_False:
					keyarray[i] = 0;
					break;
				}
				return;
			}
		}
		FUDMFKey ukey;
		ukey.Key = key;
		switch (sc.TokenType)
		{
		case TK_IntConst:
			ukey = sc.Number;
			break;
		case TK_FloatConst:
			ukey = sc.Float;
			break;
		default:
		case TK_StringConst:
			ukey = parsedString;
			break;
		case TK_True:
			ukey = 1;
			break;
		case TK_False:
			ukey = 0;
			break;
		}
		keyarray.Push(ukey);
	}